

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShowSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::ShowSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,ShowSpecsOf<sciplot::TicsSpecs> *this)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "no";
  if (this->m_show != false) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

auto ShowSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    return m_show ? "" : "no";
}